

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O3

int anon_unknown.dwarf_15a38eb::ParseIndex
              (string *str,optional<(anonymous_namespace)::Args> *progress,ArrayIndex max)

{
  bool bVar1;
  json_error *pjVar2;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> message;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> message_00;
  unsigned_long lindex;
  cmAlphaNum sizeStr;
  uint local_b0 [2];
  basic_string_view<char,_std::char_traits<char>_> local_a8;
  size_type local_98;
  pointer pcStack_90;
  undefined8 local_88;
  char *local_80;
  size_type local_78;
  pointer local_70;
  undefined8 local_68;
  char *local_60;
  cmAlphaNum local_58;
  
  bVar1 = cmStrToULong(str,(unsigned_long *)local_b0);
  if (!bVar1) {
    pjVar2 = (json_error *)__cxa_allocate_exception(0x28);
    local_a8._M_len = 0x1f;
    local_a8._M_str = "expected an array index, got: \'";
    pcStack_90 = (str->_M_dataplus)._M_p;
    local_98 = str->_M_string_length;
    local_88 = 1;
    local_80 = "\'";
    message._M_len = 3;
    message._M_array = &local_a8;
    json_error::json_error
              (pjVar2,message,
               (optional<(anonymous_namespace)::Args>)
               (progress->super__Optional_base<(anonymous_namespace)::Args,_true,_true>)._M_payload.
               super__Optional_payload_base<(anonymous_namespace)::Args>);
    __cxa_throw(pjVar2,&(anonymous_namespace)::json_error::typeinfo,
                std::runtime_error::~runtime_error);
  }
  if (local_b0[0] < max) {
    return local_b0[0];
  }
  cmAlphaNum::cmAlphaNum(&local_58,max);
  pjVar2 = (json_error *)__cxa_allocate_exception(0x28);
  local_a8._M_len = 0x1c;
  local_a8._M_str = "expected an index less than ";
  local_98 = local_58.View_._M_len;
  pcStack_90 = local_58.View_._M_str;
  local_88 = 6;
  local_80 = " got \'";
  local_70 = (str->_M_dataplus)._M_p;
  local_78 = str->_M_string_length;
  local_68 = 1;
  local_60 = "\'";
  message_00._M_len = 5;
  message_00._M_array = &local_a8;
  json_error::json_error
            (pjVar2,message_00,
             (optional<(anonymous_namespace)::Args>)
             (progress->super__Optional_base<(anonymous_namespace)::Args,_true,_true>)._M_payload.
             super__Optional_payload_base<(anonymous_namespace)::Args>);
  __cxa_throw(pjVar2,&(anonymous_namespace)::json_error::typeinfo,std::runtime_error::~runtime_error
             );
}

Assistant:

int ParseIndex(
  const std::string& str, cm::optional<Args> const& progress = cm::nullopt,
  Json::ArrayIndex max = std::numeric_limits<Json::ArrayIndex>::max())
{
  unsigned long lindex;
  if (!cmStrToULong(str, &lindex)) {
    throw json_error({ "expected an array index, got: '"_s, str, "'"_s },
                     progress);
  }
  Json::ArrayIndex index = static_cast<Json::ArrayIndex>(lindex);
  if (index >= max) {
    cmAlphaNum sizeStr{ max };
    throw json_error({ "expected an index less than "_s, sizeStr.View(),
                       " got '"_s, str, "'"_s },
                     progress);
  }
  return index;
}